

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O3

void makePreviewImage(Array2D<Imf_3_4::Rgba> *pixels,int width,int height,
                     Array2D<Imf_3_4::PreviewRgba> *previewPixels,int *previewWidth,
                     int *previewHeight)

{
  int iVar1;
  Rgba *pRVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  
  iVar10 = width + 7;
  if (-1 < width) {
    iVar10 = width;
  }
  *previewWidth = iVar10 >> 3;
  iVar10 = height + 7;
  if (-1 < height) {
    iVar10 = height;
  }
  iVar10 = iVar10 >> 3;
  *previewHeight = iVar10;
  lVar3 = (long)iVar10;
  iVar1 = *previewWidth;
  uVar12 = iVar1 * lVar3;
  pvVar4 = operator_new__(-(ulong)(uVar12 >> 0x3e != 0) | uVar12 * 4);
  if (uVar12 != 0) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pvVar4 + lVar5) = 0xff000000;
      lVar5 = lVar5 + 4;
    } while (uVar12 * 4 - lVar5 != 0);
  }
  if (*(void **)(previewPixels + 0x10) != (void *)0x0) {
    operator_delete__(*(void **)(previewPixels + 0x10));
    iVar10 = *previewHeight;
  }
  *(long *)previewPixels = lVar3;
  *(long *)(previewPixels + 8) = (long)iVar1;
  *(void **)(previewPixels + 0x10) = pvVar4;
  if (0 < iVar10) {
    uVar12 = (ulong)(uint)*previewWidth;
    lVar3 = 0;
    lVar5 = 0;
    lVar8 = 0;
    do {
      if (0 < (int)uVar12) {
        lVar11 = 4;
        lVar9 = 0;
        lVar6 = _imath_half_to_float_table;
        do {
          lVar13 = pixels->_sizeY * lVar3;
          pRVar2 = pixels->_data;
          lVar7 = *(long *)(previewPixels + 8) * lVar5 + *(long *)(previewPixels + 0x10);
          fVar15 = *(float *)(lVar6 + (ulong)*(ushort *)((long)pRVar2 + lVar11 + -4 + lVar13) * 4);
          if (fVar15 <= 0.0) {
            fVar15 = 0.0;
          }
          fVar14 = powf(fVar15 * 5.5555,0.4545);
          fVar14 = fVar14 * 84.66;
          fVar15 = 255.0;
          if (fVar14 <= 255.0) {
            fVar15 = fVar14;
          }
          *(char *)(lVar7 + lVar9 * 4) = (char)(int)(float)(~-(uint)(fVar14 < 0.0) & (uint)fVar15);
          fVar15 = *(float *)(_imath_half_to_float_table +
                             (ulong)*(ushort *)((long)pRVar2 + lVar11 + -2 + lVar13) * 4);
          if (fVar15 <= 0.0) {
            fVar15 = 0.0;
          }
          fVar14 = powf(fVar15 * 5.5555,0.4545);
          fVar14 = fVar14 * 84.66;
          fVar15 = 255.0;
          if (fVar14 <= 255.0) {
            fVar15 = fVar14;
          }
          *(char *)(lVar7 + 1 + lVar9 * 4) =
               (char)(int)(float)(~-(uint)(fVar14 < 0.0) & (uint)fVar15);
          fVar15 = *(float *)(_imath_half_to_float_table +
                             (ulong)*(ushort *)((long)&(pRVar2->r)._h + lVar11 + lVar13) * 4);
          if (fVar15 <= 0.0) {
            fVar15 = 0.0;
          }
          fVar14 = powf(fVar15 * 5.5555,0.4545);
          fVar14 = fVar14 * 84.66;
          fVar15 = 255.0;
          if (fVar14 <= 255.0) {
            fVar15 = fVar14;
          }
          *(char *)(lVar7 + 2 + lVar9 * 4) =
               (char)(int)(float)(~-(uint)(fVar14 < 0.0) & (uint)fVar15);
          lVar6 = _imath_half_to_float_table;
          fVar14 = *(float *)(_imath_half_to_float_table +
                             (ulong)*(ushort *)((long)&(pRVar2->g)._h + lVar11 + lVar13) * 4) *
                   255.0;
          fVar15 = 255.0;
          if (fVar14 <= 255.0) {
            fVar15 = fVar14;
          }
          *(char *)(lVar7 + 3 + lVar9 * 4) =
               (char)(int)(float)(-(uint)(fVar14 < 0.0) & 0x3f000000 |
                                 ~-(uint)(fVar14 < 0.0) & (uint)(fVar15 + 0.5));
          lVar9 = lVar9 + 1;
          uVar12 = (ulong)*previewWidth;
          lVar11 = lVar11 + 0x40;
        } while (lVar9 < (long)uVar12);
        iVar10 = *previewHeight;
      }
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 4;
      lVar3 = lVar3 + 0x40;
    } while (lVar8 < iVar10);
  }
  return;
}

Assistant:

void
makePreviewImage (
    const Array2D<Rgba>&  pixels,
    int                   width,
    int                   height,
    Array2D<PreviewRgba>& previewPixels,
    int&                  previewWidth,
    int&                  previewHeight)
{
    const int N = 8;

    previewWidth  = width / N;
    previewHeight = height / N;

    previewPixels.resizeErase (previewHeight, previewWidth);

    for (int y = 0; y < previewHeight; ++y)
    {
        for (int x = 0; x < previewWidth; ++x)
        {

            const Rgba&  inPixel  = pixels[y * N][x * N];
            PreviewRgba& outPixel = previewPixels[y][x];

            outPixel.r = gamma (inPixel.r);
            outPixel.g = gamma (inPixel.g);
            outPixel.b = gamma (inPixel.b);
            outPixel.a = static_cast<int> (IMATH_NAMESPACE::clamp (inPixel.a * 255.f, 0.f, 255.f) + 0.5f);
        }
    }
}